

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathNodeSetRemove(xmlNodeSetPtr cur,int val)

{
  xmlNodePtr ns;
  xmlNodePtr *ppxVar1;
  int iVar2;
  long lVar3;
  
  if ((cur != (xmlNodeSetPtr)0x0) && (iVar2 = cur->nodeNr, val < iVar2)) {
    lVar3 = (long)val;
    ns = cur->nodeTab[lVar3];
    if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
      xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
      iVar2 = cur->nodeNr;
    }
    iVar2 = iVar2 + -1;
    cur->nodeNr = iVar2;
    for (; ppxVar1 = cur->nodeTab, lVar3 < iVar2; lVar3 = lVar3 + 1) {
      ppxVar1[lVar3] = ppxVar1[lVar3 + 1];
    }
    ppxVar1[iVar2] = (xmlNodePtr)0x0;
  }
  return;
}

Assistant:

void
xmlXPathNodeSetRemove(xmlNodeSetPtr cur, int val) {
    if (cur == NULL) return;
    if (val >= cur->nodeNr) return;
    if ((cur->nodeTab[val] != NULL) &&
	(cur->nodeTab[val]->type == XML_NAMESPACE_DECL))
	xmlXPathNodeSetFreeNs((xmlNsPtr) cur->nodeTab[val]);
    cur->nodeNr--;
    for (;val < cur->nodeNr;val++)
        cur->nodeTab[val] = cur->nodeTab[val + 1];
    cur->nodeTab[cur->nodeNr] = NULL;
}